

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_message.c
# Opt level: O2

char * cmime_message_generate_message_id(void)

{
  char cVar1;
  int iVar2;
  int iVar3;
  char *__name;
  size_t sVar4;
  char *__dest;
  long lVar5;
  char *pcVar6;
  int iVar7;
  
  __name = (char *)malloc(0x40);
  gethostname(__name,0x40);
  sVar4 = strlen(__name);
  __dest = (char *)malloc(sVar4 + 0x14);
  iVar3 = 0;
  pcVar6 = __dest;
  for (iVar7 = 0; iVar7 != 2; iVar7 = iVar7 + 1) {
    for (lVar5 = 0; lVar5 != 8; lVar5 = lVar5 + 1) {
      iVar2 = cmime_util_rand();
      pcVar6[lVar5] = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ"[iVar2 % 0x24];
    }
    cVar1 = '@';
    if (iVar7 == 0) {
      cVar1 = '.';
    }
    __dest[iVar3 + 8] = cVar1;
    iVar3 = iVar3 + 9;
    pcVar6 = pcVar6 + 9;
  }
  __dest[iVar3] = '\0';
  strcat(__dest,__name);
  free(__name);
  return __dest;
}

Assistant:

char *cmime_message_generate_message_id(void) {
    char *mid = NULL;
    char *hostname = NULL;
    static const char base36[] = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ";
    int i,i2;
    int pos = 0;

    hostname = (char *)malloc(MAXHOSTNAMELEN);
    gethostname(hostname,MAXHOSTNAMELEN);
        
    mid = (char *)malloc(20 + strlen(hostname));
    for(i=0; i < 2; i++) {
        for (i2=0; i2<8; i2++) 
            mid[pos++] = base36[cmime_util_rand() % 36];
        
        if (i==0)
            mid[pos++] = '.';
        else
            mid[pos++] = '@';
    }
    mid[pos] = '\0';
    strcat(mid,hostname);
    free(hostname);
    return(mid);
}